

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolGetSysFn_FixedPoint(SUNNonlinearSolver NLS,SUNNonlinSolSysFn *SysFn)

{
  if (NLS != (SUNNonlinearSolver)0x0) {
    *SysFn = *NLS->content;
    return 0;
  }
  return -1;
}

Assistant:

int SUNNonlinSolGetSysFn_FixedPoint(SUNNonlinearSolver NLS, SUNNonlinSolSysFn *SysFn)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return the nonlinear system defining function */
  *SysFn = FP_CONTENT(NLS)->Sys;
  return(SUN_NLS_SUCCESS);
}